

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O0

void GC::DelSoftRoot(DObject *obj)

{
  bool bVar1;
  long *local_18;
  DObject **probe;
  DObject *obj_local;
  
  if ((obj->ObjectFlags & 0x10) != 0) {
    obj->ObjectFlags = obj->ObjectFlags & 0xffffffef;
    local_18 = &SoftRoots;
    while( true ) {
      bVar1 = false;
      if (*local_18 != 0) {
        bVar1 = (DObject *)*local_18 != obj;
      }
      if (!bVar1) break;
      local_18 = (long *)(*local_18 + 0x10);
    }
    if ((DObject *)*local_18 == obj) {
      *local_18 = (long)obj->ObjNext;
      obj->ObjNext = Root;
      Root = obj;
    }
  }
  return;
}

Assistant:

void DelSoftRoot(DObject *obj)
{
	DObject **probe;

	if (!(obj->ObjectFlags & OF_Rooted))
	{ // Not rooted, so nothing to do.
		return;
	}
	obj->ObjectFlags &= ~OF_Rooted;
	// Move object out of the soft roots part of the list.
	probe = &SoftRoots;
	while (*probe != NULL && *probe != obj)
	{
		probe = &(*probe)->ObjNext;
	}
	if (*probe == obj)
	{
		*probe = obj->ObjNext;
		obj->ObjNext = Root;
		Root = obj;
	}
}